

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TgCannonVerify(Abc_TgMan_t *pMan)

{
  uint nVars;
  uint uCanonPhase;
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  ulong uVar8;
  char acStack_38 [16];
  
  puVar1 = pMan->pTruth;
  nVars = pMan->nVars;
  __n = (size_t)(int)nVars;
  uVar3 = 1 << ((byte)nVars - 6 & 0x1f);
  if ((long)__n < 7) {
    uVar3 = 1;
  }
  uCanonPhase = pMan->uPhase;
  if ((long)__n < 6) {
    uVar4 = 1L << ((byte)nVars & 0x3f);
    uVar2 = *puVar1;
    uVar8 = ~(-1L << ((byte)uVar4 & 0x3f)) & uVar2;
    uVar6 = uVar4;
    uVar7 = uVar8;
    if (nVars < 6) {
      do {
        uVar7 = uVar7 | uVar8 << ((byte)uVar6 & 0x3f);
        uVar6 = uVar6 + uVar4;
      } while (uVar6 < 0x40);
    }
    if (uVar2 != uVar7) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  if ((int)uVar3 < 1) {
    memcpy(acStack_38,pMan->pPermT,__n);
    Abc_TtImplementNpnConfig(&Abc_TtCannonVerify_pCopy2,nVars,acStack_38,uCanonPhase);
  }
  else {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&Abc_TtCannonVerify_pCopy2 + lVar5) =
           *(undefined8 *)((long)puVar1 + lVar5);
      lVar5 = lVar5 + 8;
    } while ((ulong)uVar3 << 3 != lVar5);
    memcpy(acStack_38,pMan->pPermT,__n);
    Abc_TtImplementNpnConfig(&Abc_TtCannonVerify_pCopy2,nVars,acStack_38,uCanonPhase);
    lVar5 = 0;
    do {
      if (*(long *)((long)gpVerCopy + lVar5) != *(long *)((long)&Abc_TtCannonVerify_pCopy2 + lVar5))
      {
        return 0;
      }
      lVar5 = lVar5 + 8;
    } while ((ulong)uVar3 << 3 != lVar5);
  }
  return 1;
}

Assistant:

static inline int Abc_TgCannonVerify(Abc_TgMan_t* pMan)
{
    return Abc_TtCannonVerify(pMan->pTruth, pMan->nVars, pMan->pPermT, pMan->uPhase);
}